

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O1

void finish_example(vw *all,audit_regressor_data *dd,example *ec)

{
  bool bVar1;
  shared_data *psVar2;
  _func_int *p_Var3;
  long lVar4;
  ostream *poVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  char local_3a [2];
  ulong local_38;
  
  if (((float)(ec->example_counter + 1) < all->sd->dump_interval) || (all->quiet != false)) {
    bVar1 = false;
  }
  else {
    local_38 = (dd->values_audited * 100) / dd->loaded_regressor_values;
    p_Var3 = (all->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var3 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var3 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) &
         0xffffff4f | 0x20;
    *(undefined8 *)
     ((all->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(all->trace_message).super_ostream._vptr_basic_ostream) = 0xc;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&all->trace_message);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
    *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 9;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
    *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 0xc;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    local_3a[0] = '%';
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3a,1);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    lVar4 = ec->example_counter + 1;
    auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = 0x45300000;
    all->sd->weighted_unlabeled_examples =
         (auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    psVar2 = all->sd;
    bVar1 = all->progress_add;
    fVar6 = all->progress_arg;
    psVar2->sum_loss_since_last_dump = 0.0;
    psVar2->old_weighted_labeled_examples = psVar2->weighted_labeled_examples;
    fVar8 = (float)(psVar2->weighted_labeled_examples + psVar2->weighted_unlabeled_examples);
    if (bVar1 == false) {
      fVar6 = fVar6 * fVar8;
    }
    else {
      fVar6 = fVar6 + fVar8;
    }
    psVar2->dump_interval = fVar6;
    bVar1 = true;
  }
  if (dd->values_audited == dd->loaded_regressor_values) {
    if (!bVar1) {
      p_Var3 = (all->trace_message).super_ostream._vptr_basic_ostream[-3];
      *(uint *)(p_Var3 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) =
           *(uint *)(p_Var3 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream)
           & 0xffffff4f | 0x20;
      *(undefined8 *)
       ((all->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
       (long)&(all->trace_message).super_ostream._vptr_basic_ostream) = 0xc;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&all->trace_message);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffff4f |
           0x80;
      *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 9;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffff4f |
           0x80;
      *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 0xc;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      local_3a[1] = 0x25;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3a + 1,1);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    set_done(all);
  }
  VW::finish_example(all,ec);
  return;
}

Assistant:

void finish_example(vw& all, audit_regressor_data& dd, example& ec)
{
  bool printed = false;
  if (ec.example_counter + 1 >= all.sd->dump_interval && !all.quiet)
  {
    print_ex(all, ec.example_counter + 1, dd.values_audited, dd.values_audited * 100 / dd.loaded_regressor_values);
    all.sd->weighted_unlabeled_examples = (double)(ec.example_counter + 1);  // used in update_dump_interval
    all.sd->update_dump_interval(all.progress_add, all.progress_arg);
    printed = true;
  }

  if (dd.values_audited == dd.loaded_regressor_values)
  {
    // all regressor values were audited
    if (!printed)
      print_ex(all, ec.example_counter + 1, dd.values_audited, 100);
    set_done(all);
  }

  VW::finish_example(all, ec);
}